

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O1

void nop_Ev(PDISASM pMyDisasm)

{
  char *pcVar1;
  int iVar2;
  undefined4 uVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  
  if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"???",4);
    (pMyDisasm->Operand1).AccessMode = 0;
    (pMyDisasm->Operand2).AccessMode = 0;
    (pMyDisasm->Operand3).AccessMode = 0;
    (pMyDisasm->Operand4).AccessMode = 0;
    (pMyDisasm->Operand5).AccessMode = 0;
    (pMyDisasm->Operand6).AccessMode = 0;
    (pMyDisasm->Operand7).AccessMode = 0;
    (pMyDisasm->Operand8).AccessMode = 0;
    uVar3 = 0xffffffff;
    lVar5 = 0x924;
    lVar6 = 0x7e8;
  }
  else {
    (pMyDisasm->Instruction).Category = 0x1000c;
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"nop",4);
    iVar2 = (pMyDisasm->Reserved_).OperandSize;
    uVar4 = 0x68;
    if (iVar2 != 0x40) {
      uVar4 = iVar2 == 0x20 | 0x66;
    }
    (pMyDisasm->Reserved_).MemDecoration = uVar4;
    decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
    (pMyDisasm->Reserved_).EIP_ =
         (pMyDisasm->Reserved_).EIP_ + (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2);
    uVar3 = 1;
    lVar5 = 0x1c8;
    lVar6 = 0x28c;
  }
  pcVar1 = pMyDisasm->CompleteInstr + lVar6 + -0x14;
  pcVar1[0] = '\0';
  pcVar1[1] = '\0';
  pcVar1[2] = '\0';
  pcVar1[3] = '\0';
  *(undefined4 *)(pMyDisasm->CompleteInstr + lVar5 + -0x14) = uVar3;
  return;
}

Assistant:

void __bea_callspec__ nop_Ev(PDISASM pMyDisasm)
{
  if (GV.VEX.state == InUsePrefix) {
    failDecode(pMyDisasm);
    return;
  }

  pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+MISCELLANEOUS_INSTRUCTION;
  #ifndef BEA_LIGHT_DISASSEMBLY
     (void) strcpy (pMyDisasm->Instruction.Mnemonic, "nop");
  #endif
  if (GV.OperandSize == 64) {
      GV.MemDecoration = Arg2qword;
  }
  else if (GV.OperandSize == 32) {
      GV.MemDecoration = Arg2dword;
  }
  else {
      GV.MemDecoration = Arg2word;
  }
  decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
  GV.EIP_ += GV.DECALAGE_EIP+2;
  pMyDisasm->Operand2.AccessMode = 0;
  pMyDisasm->Operand1.AccessMode = READ;
}